

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O2

void __thiscall
rsg::BinaryOp<4,_(rsg::Associativity)0>::tokenize
          (BinaryOp<4,_(rsg::Associativity)0> *this,GeneratorState *state,TokenStream *str)

{
  Token local_28;
  
  (*this->m_leftValueExpr->_vptr_Expression[3])();
  local_28.m_type = this->m_operator;
  TokenStream::operator<<(str,&local_28);
  Token::~Token(&local_28);
  (*this->m_rightValueExpr->_vptr_Expression[3])(this->m_rightValueExpr,state,str);
  return;
}

Assistant:

void BinaryOp<Precedence, Assoc>::tokenize (GeneratorState& state, TokenStream& str) const
{
	m_leftValueExpr->tokenize(state, str);
	str << m_operator;
	m_rightValueExpr->tokenize(state, str);
}